

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O0

void __thiscall
jrtplib::RTPFakeTransmissionInfo::RTPFakeTransmissionInfo
          (RTPFakeTransmissionInfo *this,list<unsigned_int,_std::allocator<unsigned_int>_> *iplist,
          RTPFakeTransmissionParams *transparams)

{
  RTPFakeTransmissionParams *transparams_local;
  list<unsigned_int,_std::allocator<unsigned_int>_> *iplist_local;
  RTPFakeTransmissionInfo *this_local;
  
  RTPTransmissionInfo::RTPTransmissionInfo(&this->super_RTPTransmissionInfo,UserDefinedProto);
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPFakeTransmissionInfo_001aeb28;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&this->localIPlist);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->localIPlist,iplist);
  this->params = transparams;
  return;
}

Assistant:

RTPFakeTransmissionInfo(std::list<uint32_t> iplist,
            RTPFakeTransmissionParams *transparams) : 
        RTPTransmissionInfo(RTPTransmitter::UserDefinedProto) 
    { localIPlist = iplist; params = transparams; }